

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O1

ssh_keyalg * ec_alg_by_oid(int len,void *oid,ec_curve **curve)

{
  ssh_keyalg *psVar1;
  undefined8 *puVar2;
  bool bVar3;
  int iVar4;
  ec_curve *peVar5;
  long lVar6;
  ssh_keyalg *local_48;
  
  lVar6 = 0;
  while( true ) {
    psVar1 = *(ssh_keyalg **)((long)ec_alg_by_oid::algs_with_oid + lVar6);
    puVar2 = (undefined8 *)psVar1->extra;
    bVar3 = true;
    if ((*(int *)(puVar2 + 3) == len) && (iVar4 = bcmp(oid,(void *)puVar2[2],(long)len), iVar4 == 0)
       ) {
      peVar5 = (ec_curve *)(*(code *)*puVar2)();
      *curve = peVar5;
      bVar3 = false;
      local_48 = psVar1;
    }
    if (!bVar3) break;
    lVar6 = lVar6 + 8;
    if (lVar6 == 0x18) {
      return (ssh_keyalg *)0x0;
    }
  }
  return local_48;
}

Assistant:

const ssh_keyalg *ec_alg_by_oid(int len, const void *oid,
                                        const struct ec_curve **curve)
{
    static const ssh_keyalg *algs_with_oid[] = {
        &ssh_ecdsa_nistp256,
        &ssh_ecdsa_nistp384,
        &ssh_ecdsa_nistp521,
    };
    int i;

    for (i = 0; i < lenof(algs_with_oid); i++) {
        const ssh_keyalg *alg = algs_with_oid[i];
        const struct ecsign_extra *extra =
            (const struct ecsign_extra *)alg->extra;
        if (len == extra->oidlen && !memcmp(oid, extra->oid, len)) {
            *curve = extra->curve();
            return alg;
        }
    }
    return NULL;
}